

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

wchar_t my_stricmp(char *s1,char *s2)

{
  byte bVar1;
  byte bVar2;
  wchar_t wVar3;
  __int32_t **pp_Var4;
  long lVar5;
  
  lVar5 = 0;
  while( true ) {
    bVar1 = s1[lVar5];
    bVar2 = s2[lVar5];
    if (bVar1 == 0 && bVar2 == 0) {
      return L'\0';
    }
    pp_Var4 = __ctype_toupper_loc();
    wVar3 = (int)(char)(*pp_Var4)[bVar1] - (int)(char)(*pp_Var4)[bVar2];
    if (wVar3 != L'\0') break;
    lVar5 = lVar5 + 1;
  }
  return wVar3;
}

Assistant:

int my_stricmp(const char *s1, const char *s2)
{
	char ch1 = 0;
	char ch2 = 0;

	/* Just loop */
	while (true) {
		/* We've reached the end of both strings simultaneously */
		if ((*s1 == 0) && (*s2 == 0)) {
			/* We're still here, so s1 and s2 are equal */
			return (0);
		}

		ch1 = toupper((unsigned char) *s1);
		ch2 = toupper((unsigned char) *s2);

		/* If the characters don't match */
		if (ch1 != ch2) {
			/* return the difference between them */
			return ((int)(ch1 - ch2));
		}

		/* Step on through both strings */
		s1++;
		s2++;
	}
}